

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

bool __thiscall
brotli::HashLongestMatchQuickly<16,_1,_true>::FindLongestMatch
          (HashLongestMatchQuickly<16,_1,_true> *this,uint8_t *ring_buffer,size_t ring_buffer_mask,
          int *distance_cache,size_t cur_ix,size_t max_length,size_t max_backward,
          size_t *best_len_out,size_t *best_len_code_out,size_t *best_distance_out,
          double *best_score_out)

{
  uint8_t *puVar1;
  double dVar2;
  uint8_t uVar3;
  ushort uVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  size_t sVar8;
  uint8_t *puVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint8_t *puVar19;
  uint32_t uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  long local_50;
  int local_38;
  
  sVar8 = *best_len_out;
  puVar1 = ring_buffer + (cur_ix & ring_buffer_mask);
  lVar6 = *(long *)(ring_buffer + (cur_ix & ring_buffer_mask));
  uVar17 = (ulong)(lVar6 * 0x1e35a7bd000000) >> 0x30;
  dVar2 = *best_score_out;
  iVar5 = *distance_cache;
  uVar13 = cur_ix - (long)iVar5;
  uVar3 = puVar1[sVar8];
  uVar20 = (uint32_t)cur_ix;
  if ((uVar13 < cur_ix) &&
     (uVar12 = (uint)uVar13 & (uint)ring_buffer_mask, uVar3 == ring_buffer[sVar8 + uVar12])) {
    if (7 < max_length) {
      uVar13 = max_length & 0xfffffffffffffff8;
      puVar19 = puVar1 + uVar13;
      local_50 = 0;
      uVar18 = 0;
LAB_00120420:
      if (*(ulong *)(puVar1 + uVar18 * 8) == *(ulong *)(ring_buffer + uVar18 * 8 + (ulong)uVar12))
      goto code_r0x0012042d;
      uVar18 = *(ulong *)(ring_buffer + uVar18 * 8 + (ulong)uVar12) ^
               *(ulong *)(puVar1 + uVar18 * 8);
      uVar13 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
        }
      }
      uVar18 = (uVar13 >> 3 & 0x1fffffff) - local_50;
      goto LAB_00120455;
    }
    uVar13 = 0;
    puVar19 = puVar1;
LAB_00120778:
    uVar11 = max_length & 7;
    uVar18 = uVar13;
    if (uVar11 != 0) {
      uVar16 = uVar13 | uVar11;
      do {
        uVar18 = uVar13;
        if (ring_buffer[uVar13 + uVar12] != *puVar19) break;
        puVar19 = puVar19 + 1;
        uVar13 = uVar13 + 1;
        uVar11 = uVar11 - 1;
        uVar18 = uVar16;
      } while (uVar11 != 0);
    }
LAB_00120455:
    if (3 < uVar18) {
      auVar22._8_4_ = (int)(uVar18 >> 0x20);
      auVar22._0_8_ = uVar18;
      auVar22._12_4_ = 0x45300000;
      *best_len_out = uVar18;
      *best_len_code_out = uVar18;
      *best_distance_out = (long)iVar5;
      *best_score_out =
           ((auVar22._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0)) * 5.4 + 0.6;
      this->buckets_[uVar17] = uVar20;
      return true;
    }
  }
  uVar12 = this->buckets_[uVar17];
  this->buckets_[uVar17] = uVar20;
  uVar10 = (uint)ring_buffer_mask & uVar12;
  if (uVar3 != ring_buffer[sVar8 + uVar10]) {
    return false;
  }
  if (cur_ix == uVar12) {
    return false;
  }
  uVar13 = cur_ix - uVar12;
  if (max_backward < uVar13) {
    return false;
  }
  if (7 < max_length) {
    uVar18 = max_length & 0xfffffffffffffff8;
    puVar19 = puVar1 + uVar18;
    lVar14 = 0;
    uVar11 = 0;
LAB_001204bb:
    if (*(ulong *)(puVar1 + uVar11 * 8) == *(ulong *)(ring_buffer + uVar11 * 8 + (ulong)uVar10))
    goto code_r0x001204c8;
    uVar11 = *(ulong *)(ring_buffer + uVar11 * 8 + (ulong)uVar10) ^ *(ulong *)(puVar1 + uVar11 * 8);
    uVar18 = 0;
    if (uVar11 != 0) {
      for (; (uVar11 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
      }
    }
    uVar11 = (uVar18 >> 3 & 0x1fffffff) - lVar14;
    goto LAB_001204f3;
  }
  uVar18 = 0;
  puVar19 = puVar1;
LAB_00120740:
  uVar16 = max_length & 7;
  uVar11 = uVar18;
  if (uVar16 != 0) {
    uVar15 = uVar18 | uVar16;
    do {
      uVar11 = uVar18;
      if (ring_buffer[uVar18 + uVar10] != *puVar19) break;
      puVar19 = puVar19 + 1;
      uVar18 = uVar18 + 1;
      uVar16 = uVar16 - 1;
      uVar11 = uVar15;
    } while (uVar16 != 0);
  }
LAB_001204f3:
  if (3 < uVar11) {
    *best_len_out = uVar11;
    *best_len_code_out = uVar11;
    auVar21._8_4_ = (int)(uVar11 >> 0x20);
    auVar21._0_8_ = uVar11;
    auVar21._12_4_ = 0x45300000;
    iVar5 = 0x1f;
    if ((uint)uVar13 != 0) {
      for (; (uint)uVar13 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    *best_distance_out = uVar13;
    *best_score_out =
         ((auVar21._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0)) * 5.4 +
         (double)iVar5 * -1.2;
    return true;
  }
  if (this->num_dict_lookups_ >> 7 <= this->num_dict_matches_) {
    this->num_dict_lookups_ = this->num_dict_lookups_ + 1;
    local_38 = (int)lVar6;
    uVar4 = *(ushort *)(kStaticDictionaryHash + (ulong)((uint)(local_38 * 0x1e35a7bd) >> 0x12) * 4);
    if (uVar4 != 0) {
      uVar12 = uVar4 & 0x1f;
      uVar13 = (ulong)uVar12;
      if (uVar13 <= max_length) {
        puVar19 = kBrotliDictionary +
                  (uVar12 * (uVar4 >> 5) + kBrotliDictionaryOffsetsByLength[uVar13]);
        if (7 < uVar12) {
          uVar11 = (ulong)(uVar4 & 0x18);
          puVar9 = puVar19 + uVar11;
          uVar18 = 0;
LAB_00120647:
          if (*(ulong *)(puVar19 + uVar18) == *(ulong *)(puVar1 + uVar18)) goto code_r0x00120654;
          uVar16 = *(ulong *)(puVar1 + uVar18) ^ *(ulong *)(puVar19 + uVar18);
          uVar11 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
            }
          }
          uVar18 = (uVar11 >> 3 & 0x1fffffff) + uVar18;
          goto LAB_00120673;
        }
        uVar11 = 0;
        puVar9 = puVar19;
LAB_001207af:
        uVar16 = uVar13 & 7;
        uVar18 = uVar11;
        if ((uVar4 & 7) != 0) {
          uVar15 = uVar11 | uVar16;
          do {
            uVar18 = uVar11;
            if (puVar1[uVar11] != *puVar9) break;
            puVar9 = puVar9 + 1;
            uVar11 = uVar11 + 1;
            uVar16 = uVar16 - 1;
            uVar18 = uVar15;
          } while (uVar16 != 0);
        }
LAB_00120673:
        bVar7 = false;
        if ((uVar18 == 0) || (uVar18 + 10 <= uVar13)) goto LAB_0012054a;
        sVar8 = (long)(1 << (""[uVar13] & 0x1f)) * (ulong)(byte)kCutoffTransforms[uVar13 - uVar18] +
                max_backward + (uVar4 >> 5) + 1;
        auVar24._8_4_ = (int)(uVar18 >> 0x20);
        auVar24._0_8_ = uVar18;
        auVar24._12_4_ = 0x45300000;
        iVar5 = 0x1f;
        uVar12 = (uint)sVar8;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        dVar23 = ((auVar24._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0)) * 5.4 +
                 (double)iVar5 * -1.2;
        if (dVar2 < dVar23) {
          this->num_dict_matches_ = this->num_dict_matches_ + 1;
          *best_len_out = uVar18;
          *best_len_code_out = uVar13;
          *best_distance_out = sVar8;
          *best_score_out = dVar23;
          bVar7 = true;
          goto LAB_0012054a;
        }
      }
    }
  }
  bVar7 = false;
LAB_0012054a:
  this->buckets_[uVar17] = uVar20;
  return bVar7;
code_r0x0012042d:
  uVar18 = uVar18 + 1;
  local_50 = local_50 + -8;
  if (max_length >> 3 == uVar18) goto LAB_00120778;
  goto LAB_00120420;
code_r0x001204c8:
  uVar11 = uVar11 + 1;
  lVar14 = lVar14 + -8;
  if (max_length >> 3 == uVar11) goto LAB_00120740;
  goto LAB_001204bb;
code_r0x00120654:
  uVar18 = uVar18 + 8;
  if (uVar11 == uVar18) goto LAB_001207af;
  goto LAB_00120647;
}

Assistant:

inline bool FindLongestMatch(const uint8_t * __restrict ring_buffer,
                               const size_t ring_buffer_mask,
                               const int* __restrict distance_cache,
                               const size_t cur_ix,
                               const size_t max_length,
                               const size_t max_backward,
                               size_t * __restrict best_len_out,
                               size_t * __restrict best_len_code_out,
                               size_t * __restrict best_distance_out,
                               double* __restrict best_score_out) {
    const size_t best_len_in = *best_len_out;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    const uint32_t key = HashBytes(&ring_buffer[cur_ix_masked]);
    int compare_char = ring_buffer[cur_ix_masked + best_len_in];
    double best_score = *best_score_out;
    size_t best_len = best_len_in;
    size_t cached_backward = static_cast<size_t>(distance_cache[0]);
    size_t prev_ix = cur_ix - cached_backward;
    bool match_found = false;
    if (prev_ix < cur_ix) {
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char == ring_buffer[prev_ix + best_len]) {
        size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                              &ring_buffer[cur_ix_masked],
                                              max_length);
        if (len >= 4) {
          best_score = BackwardReferenceScoreUsingLastDistance(len, 0);
          best_len = len;
          *best_len_out = len;
          *best_len_code_out = len;
          *best_distance_out = cached_backward;
          *best_score_out = best_score;
          compare_char = ring_buffer[cur_ix_masked + best_len];
          if (kBucketSweep == 1) {
            buckets_[key] = static_cast<uint32_t>(cur_ix);
            return true;
          } else {
            match_found = true;
          }
        }
      }
    }
    if (kBucketSweep == 1) {
      // Only one to look for, don't bother to prepare for a loop.
      prev_ix = buckets_[key];
      buckets_[key] = static_cast<uint32_t>(cur_ix);
      size_t backward = cur_ix - prev_ix;
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char != ring_buffer[prev_ix + best_len_in]) {
        return false;
      }
      if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
        return false;
      }
      const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                  &ring_buffer[cur_ix_masked],
                                                  max_length);
      if (len >= 4) {
        *best_len_out = len;
        *best_len_code_out = len;
        *best_distance_out = backward;
        *best_score_out = BackwardReferenceScore(len, backward);
        return true;
      }
    } else {
      uint32_t *bucket = buckets_ + key;
      prev_ix = *bucket++;
      for (int i = 0; i < kBucketSweep; ++i, prev_ix = *bucket++) {
        const size_t backward = cur_ix - prev_ix;
        prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
        if (compare_char != ring_buffer[prev_ix + best_len]) {
          continue;
        }
        if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
          continue;
        }
        const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                    &ring_buffer[cur_ix_masked],
                                                    max_length);
        if (len >= 4) {
          const double score = BackwardReferenceScore(len, backward);
          if (best_score < score) {
            best_score = score;
            best_len = len;
            *best_len_out = best_len;
            *best_len_code_out = best_len;
            *best_distance_out = backward;
            *best_score_out = score;
            compare_char = ring_buffer[cur_ix_masked + best_len];
            match_found = true;
          }
        }
      }
    }
    if (kUseDictionary && !match_found &&
        num_dict_matches_ >= (num_dict_lookups_ >> 7)) {
      ++num_dict_lookups_;
      const uint32_t dict_key = Hash<14>(&ring_buffer[cur_ix_masked]) << 1;
      const uint16_t v = kStaticDictionaryHash[dict_key];
      if (v > 0) {
        const uint32_t len = v & 31;
        const uint32_t dist = v >> 5;
        const size_t offset =
            kBrotliDictionaryOffsetsByLength[len] + len * dist;
        if (len <= max_length) {
          const size_t matchlen =
              FindMatchLengthWithLimit(&ring_buffer[cur_ix_masked],
                                       &kBrotliDictionary[offset], len);
          if (matchlen + kCutoffTransformsCount > len && matchlen > 0) {
            const size_t transform_id = kCutoffTransforms[len - matchlen];
            const size_t word_id =
                transform_id * (1 << kBrotliDictionarySizeBitsByLength[len]) +
                dist;
            const size_t backward = max_backward + word_id + 1;
            const double score = BackwardReferenceScore(matchlen, backward);
            if (best_score < score) {
              ++num_dict_matches_;
              best_score = score;
              best_len = matchlen;
              *best_len_out = best_len;
              *best_len_code_out = len;
              *best_distance_out = backward;
              *best_score_out = best_score;
              match_found = true;
            }
          }
        }
      }
    }
    const uint32_t off = (cur_ix >> 3) % kBucketSweep;
    buckets_[key + off] = static_cast<uint32_t>(cur_ix);
    return match_found;
  }